

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplexNoise.cpp
# Opt level: O3

float __thiscall SimplexNoise::fractal(SimplexNoise *this,size_t octaves,float x,float y)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float local_28;
  float fStack_24;
  
  if (octaves != 0) {
    fVar1 = this->mFrequency;
    fVar3 = this->mAmplitude;
    uVar2 = this->mLacunarity;
    uVar4 = this->mPersistence;
    fVar5 = 0.0;
    do {
      fVar6 = noise(fVar1 * x,fVar1 * y);
      fVar5 = fVar5 + fVar3 * fVar6;
      fVar1 = fVar1 * (float)uVar2;
      fVar3 = fVar3 * (float)uVar4;
      octaves = octaves - 1;
    } while (octaves != 0);
    return fVar5;
  }
  return 0.0;
}

Assistant:

float SimplexNoise::fractal(size_t octaves, float x, float y) const {
    float output = 0.f;
    float frequency = mFrequency;
    float amplitude = mAmplitude;

    for (size_t i = 0; i < octaves; i++) {
        output += (amplitude * noise(x * frequency, y * frequency));

        frequency *= mLacunarity;
        amplitude *= mPersistence;
    }

    return output;
}